

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall r_comp::Decompiler::write_indent(Decompiler *this,uint16_t i)

{
  undefined8 in_RAX;
  uint16_t j;
  ushort uVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  OutStream::operator<<(this->out_stream,(char (*) [2])0x146232);
  this->indents = i;
  for (uVar1 = 0; uVar1 < i; uVar1 = uVar1 + 1) {
    uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
    OutStream::operator<<(this->out_stream,(char *)((long)&uStack_28 + 7));
    i = this->indents;
  }
  return;
}

Assistant:

void Decompiler::write_indent(uint16_t i)
{
    *out_stream << "\n";
    indents = i;

    for (uint16_t j = 0; j < indents; j++) {
        *out_stream << ' ';
    }
}